

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setMinimumExponentDigits(DecimalFormat *this,int8_t minExpDig)

{
  DecimalFormatProperties *pDVar1;
  undefined3 in_register_00000031;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumExponentDigits == CONCAT31(in_register_00000031,minExpDig)) {
    return;
  }
  pDVar1->minimumExponentDigits = CONCAT31(in_register_00000031,minExpDig);
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMinimumExponentDigits(int8_t minExpDig) {
    if (minExpDig == fields->properties->minimumExponentDigits) { return; }
    fields->properties->minimumExponentDigits = minExpDig;
    touchNoError();
}